

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_optimize(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,bool *interrupt)

{
  undefined1 *puVar1;
  double dVar2;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  Settings *pSVar4;
  Statistics *pSVar5;
  bool applySimplifier;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  puVar1 = &(this->_solReal).field_0xe0;
  *puVar1 = *puVar1 & 0xf0;
  this->_optimizeCalls = this->_optimizeCalls + 1;
  (*this->_statistics->solvingTime->_vptr_Timer[3])();
  if (this->_currentSettings->_boolParamValues[9] == true) {
    pSVar3 = this->_scaler;
    if (pSVar3 == (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
LAB_0049f4ae:
      if (this->_realLP->_isScaled == true) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::unscaleLPandReloadBasis(&this->_solver);
        this->_isRealLPScaled = false;
        this->_unscaleCalls = this->_unscaleCalls + 1;
      }
    }
    else if ((this->_realLP->_isScaled != false) ||
            ((10 < this->_optimizeCalls &&
             ((double)this->_optimizeCalls * 0.1 < (double)this->_unscaleCalls)))) {
      if (pSVar3 == (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) goto LAB_0049f4ae;
    }
    else {
      (*pSVar3->_vptr_SPxScaler[0xd])(pSVar3,this->_realLP,1);
      this->_isRealLPScaled = this->_realLP->_isScaled;
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::invalidate(&(this->_solver).
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  );
      (*(this->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x77])(&this->_solver);
      (*(this->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(&this->_solver);
    }
  }
  this->_lastSolveMode = 0;
  if (this->_hasBasis == false) {
    pSVar4 = this->_currentSettings;
    dVar2 = pSVar4->_realParamValues[6];
    if ((pSVar4->_realParamValues[8] == -dVar2) &&
       (!NAN(pSVar4->_realParamValues[8]) && !NAN(-dVar2))) {
      applySimplifier = true;
      if ((pSVar4->_realParamValues[9] == dVar2) &&
         (!NAN(pSVar4->_realParamValues[9]) && !NAN(dVar2))) goto LAB_0049f579;
    }
  }
  applySimplifier = false;
LAB_0049f579:
  _preprocessAndSolveReal(this,applySimplifier,interrupt);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::getMatrixMetric(&local_68,
                    &(this->_solver).
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,0);
  pSVar5 = this->_statistics;
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[0xc] = local_68.m_backend.data._M_elems[0xc]
  ;
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[0xd] = local_68.m_backend.data._M_elems[0xd]
  ;
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[0xe] = local_68.m_backend.data._M_elems[0xe]
  ;
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[0xf] = local_68.m_backend.data._M_elems[0xf]
  ;
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[8] = local_68.m_backend.data._M_elems[8];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[9] = local_68.m_backend.data._M_elems[9];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[10] = local_68.m_backend.data._M_elems[10];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[0xb] = local_68.m_backend.data._M_elems[0xb]
  ;
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[6] = local_68.m_backend.data._M_elems[6];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[7] = local_68.m_backend.data._M_elems[7];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
  (pSVar5->finalBasisCondition).m_backend.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
  (pSVar5->finalBasisCondition).m_backend.exp = local_68.m_backend.exp;
  (pSVar5->finalBasisCondition).m_backend.neg = local_68.m_backend.neg;
  (pSVar5->finalBasisCondition).m_backend.fpclass = local_68.m_backend.fpclass;
  (pSVar5->finalBasisCondition).m_backend.prec_elem = local_68.m_backend.prec_elem;
  (*this->_statistics->solvingTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SoPlexBase<R>::_optimize(volatile bool* interrupt)
{
   assert(_realLP != nullptr);
   assert(_realLP == &_solver);

   _solReal.invalidate();
   ++_optimizeCalls;

   // start timing
   _statistics->solvingTime->start();

   if(boolParam(SoPlexBase<R>::PERSISTENTSCALING))
   {
      // scale original problem; overwriting _realLP
      if(_scaler && !_realLP->isScaled() && _reapplyPersistentScaling())
      {
#ifdef SOPLEX_DEBUG
         SPxLPBase<R>* origLP = 0;
         spx_alloc(origLP);
         origLP = new(origLP) SPxLPBase<R>(*_realLP);
#endif
         _scaler->scale(*_realLP, true);
         _isRealLPScaled = _realLP->isScaled(); // a scaler might decide not to apply scaling
         _solver.invalidateBasis();
#ifdef SOPLEX_DEBUG
         _checkScaling(origLP);
#endif
      }
      // unscale previously scaled problem, overwriting _realLP
      else if(!_scaler && _realLP->isScaled())
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }
   }

   // remember that last solve was in floating-point
   _lastSolveMode = SOLVEMODE_REAL;

   // solve and store solution; if we have a starting basis, do not apply preprocessing; if we are solving from
   // scratch, apply preprocessing according to parameter settings
   if(!_hasBasis && realParam(SoPlexBase<R>::OBJLIMIT_LOWER) == -realParam(SoPlexBase<R>::INFTY)
         && realParam(SoPlexBase<R>::OBJLIMIT_UPPER) == realParam(SoPlexBase<R>::INFTY))
      _preprocessAndSolveReal(true, interrupt);
   else
      _preprocessAndSolveReal(false, interrupt);

   _statistics->finalBasisCondition = _solver.getBasisMetric(0);

   // stop timing
   _statistics->solvingTime->stop();
}